

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O3

unique_ptr<pstore::sparse_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::uint128>,_std::default_delete<pstore::sparse_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::uint128>_>_>
 pstore::sparse_array<std::__cxx11::string,pstore::uint128>::
 make_unique<std::pair<unsigned_long,std::__cxx11::string>const*>
           (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *begin,pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *end)

{
  pair_field_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  first;
  pair_field_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  first_index;
  pair_field_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  last;
  pair_field_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  last_index;
  pair_field_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
  first_value;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RAX;
  uint128 *puVar1;
  sparse_array<std::__cxx11::string,pstore::uint128> *this;
  sparse_array<std::__cxx11::string,pstore::uint128> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 unaff_RBX;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *unaff_R12;
  undefined8 unaff_R14;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *unaff_R15;
  undefined8 unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  
  first._8_8_ = unaff_RBX;
  first.it_ = in_RAX;
  last._8_8_ = unaff_R14;
  last.it_ = unaff_R12;
  puVar1 = bitmap<pstore::details::pair_field_iterator<std::pair<unsigned_long,std::__cxx11::string>const*,pstore::details::get_accessor<0ul,std::pair<unsigned_long,std::__cxx11::string>const*>()::_lambda(std::pair<unsigned_long,std::__cxx11::string>const*)_1_const>,void>
                     ((uint128 *)end,in_RDX,first,last);
  this = (sparse_array<std::__cxx11::string,pstore::uint128> *)
         operator_new((ulong)(((int)POPCOUNT(extraout_RDX) + (int)POPCOUNT(puVar1) +
                              (uint)((int)POPCOUNT(extraout_RDX) + (int)POPCOUNT(puVar1) == 0)) *
                              0x20 | 0x10));
  first_index._8_8_ = unaff_RBX;
  first_index.it_ = in_RAX;
  last_index._8_8_ = unaff_R14;
  last_index.it_ = unaff_R12;
  first_value._8_8_ = unaff_retaddr;
  first_value.it_ = unaff_R15;
  sparse_array<pstore::details::pair_field_iterator<std::pair<unsigned_long,std::__cxx11::string>const*,pstore::details::get_accessor<0ul,std::pair<unsigned_long,std::__cxx11::string>const*>()::_lambda(std::pair<unsigned_long,std::__cxx11::string>const*)_1_const>,pstore::details::pair_field_iterator<std::pair<unsigned_long,std::__cxx11::string>const*,pstore::details::get_accessor<1ul,std::pair<unsigned_long,std::__cxx11::string>const*>()::_lambda(std::pair<unsigned_long,std::__cxx11::string>const*)_1_const>>
            (this,first_index,last_index,first_value,
             (pair_field_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_const_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_include_pstore_adt_sparse_array_hpp:122:20)>
              )in_stack_00000008);
  begin->first = (unsigned_long)this;
  return (__uniq_ptr_data<pstore::sparse_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::uint128>,_std::default_delete<pstore::sparse_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::uint128>_>,_true,_true>
          )(__uniq_ptr_data<pstore::sparse_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::uint128>,_std::default_delete<pstore::sparse_array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::uint128>_>,_true,_true>
            )begin;
}

Assistant:

auto sparse_array<ValueType, BitmapType>::make_unique (Iterator begin, Iterator end)
        -> std::unique_ptr<sparse_array> {

        using details::get_accessor;
        using details::pair_field_iterator;

        auto const accessor0 = get_accessor<0U, Iterator> ();
        auto const accessor1 = get_accessor<1U, Iterator> ();

        // [begin0, end0) is the range of indices; [begin1, end1] is the range of values.
        auto const begin0 = pair_field_iterator<Iterator, decltype (accessor0)>{begin, accessor0};
        auto const end0 = pair_field_iterator<Iterator, decltype (accessor0)>{end, accessor0};
        auto const begin1 = pair_field_iterator<Iterator, decltype (accessor1)>{begin, accessor1};
        auto const end1 = pair_field_iterator<Iterator, decltype (accessor1)>{end, accessor1};

        return std::unique_ptr<sparse_array<ValueType, BitmapType>>{
            new (begin0, end0) sparse_array<ValueType, BitmapType> (begin0, end0, begin1, end1)};
    }